

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_splitor_test.cc
# Opt level: O2

void __thiscall
xLearn::SpliterTest_ReadTest_Test::~SpliterTest_ReadTest_Test(SpliterTest_ReadTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SpliterTest, ReadTest) {
  char* line = new char[kMaxLineSize];
  // For each small file
  int num = -1;
  for (int i = 0; i < kNumfolds; ++i) {
    string filename = StringPrintf("%s_%d", kTestfilename.c_str(), i);
    FILE* file_ptr = OpenFileOrDie(filename.c_str(), "r");
    // Read every lines
    while (fgets(line, kMaxLineSize, file_ptr) != nullptr) {
      num++;
      string strTmp;
      int read_len = strlen(line);
      line[read_len - 1] = '\0';
      strTmp.assign(line);
      EXPECT_EQ(strTmp, StringPrintf("%d", num));
    }
    Close(file_ptr);
  }
}